

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  long *plVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  char input_lable;
  char check_fold [100];
  M_tree mtree_head;
  allocator local_1be;
  byte local_1bd;
  int local_1bc;
  long *local_1b8 [2];
  long local_1a8 [2];
  char local_198 [112];
  undefined1 local_128 [216];
  string local_50 [32];
  
  local_1bc = argc;
  if (argc == 1 || 3 < argc) {
    puts("error parameters");
  }
  else {
    M_tree::M_tree((M_tree *)local_128);
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"1. Building the M_tree.",0x17);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"2. Updating the M_tree.",0x17);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"3. Checking the difference between two folder.",0x2e);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Please input 1~3 to using these function!",0x29);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
      std::operator>>((istream *)&std::cin,(char *)&local_1bd);
      if (local_1bd < 0x33) {
        if (local_1bd == 0x31) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "**************** We are building the Merkle tree. Please wait... ****************"
                     ,0x51);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
          std::ostream::put('(');
          std::ostream::flush();
          std::__cxx11::string::string((string *)local_1b8,argv[1],&local_1be);
          std::__cxx11::string::operator=((string *)(local_128 + 0xb8),(string *)local_1b8);
          if (local_1b8[0] != local_1a8) {
            operator_delete(local_1b8[0],local_1a8[0] + 1);
          }
          iVar2 = 1;
          M_tree::build((M_tree *)local_128,argv[1],1);
        }
        else {
          if (local_1bd != 0x32) {
LAB_00102735:
            lVar4 = 0x31;
            pcVar5 = "You inputed a wrong alphabet, Please input again.";
            goto LAB_00102741;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "**************** We are updating the Merkle tree. Please wait... ****************"
                     ,0x51);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
          std::ostream::put('(');
          std::ostream::flush();
          iVar2 = 2;
          M_tree::update((M_tree *)local_128);
        }
        M_tree::show((M_tree *)local_128,1,iVar2);
      }
      else if (local_1bd == 0x33) {
        M_tree::build((M_tree *)local_128,argv[1],1);
        std::__cxx11::string::string((string *)local_1b8,argv[1],&local_1be);
        std::__cxx11::string::operator=((string *)(local_128 + 0xb8),(string *)local_1b8);
        if (local_1b8[0] != local_1a8) {
          operator_delete(local_1b8[0],local_1a8[0] + 1);
        }
        if (local_1bc == 2) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "Please input the address, we will check their difference.",0x39);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
          std::ostream::put('(');
          std::ostream::flush();
          lVar4 = *(long *)(__gmon_start__ + *(long *)(std::cin + -0x18));
          std::__istream_extract((istream *)&std::cin,local_198,100);
          if (((*(int *)(std::__cxx11::string::append + *(long *)(std::cin + -0x18)) == 0) &&
              (lVar4 - 0x65U < 0xffffffffffffff9c)) &&
             (plVar1 = *(long **)(*(long *)(std::cin + -0x18) + 0x10c2b0),
             (ulong)plVar1[3] <= (ulong)plVar1[2])) {
            iVar2 = (**(code **)(*plVar1 + 0x48))();
            if (iVar2 == -1) {
              std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x10c1c8);
            }
          }
          local_1b8[0] = local_1a8;
          sVar3 = strlen(local_198);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1b8,local_198,local_198 + sVar3);
          main_cold_1();
          M_tree::build((M_tree *)local_128,local_198,3);
        }
        else {
          std::__cxx11::string::string((string *)local_1b8,argv[2],&local_1be);
          std::__cxx11::string::operator=(local_50,(string *)local_1b8);
          if (local_1b8[0] != local_1a8) {
            operator_delete(local_1b8[0],local_1a8[0] + 1);
          }
          M_tree::build((M_tree *)local_128,argv[2],3);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "**************** We are checking the difference. Please wait... ****************"
                   ,0x50);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
        std::ostream::put('(');
        std::ostream::flush();
        M_tree::compare((M_tree *)local_128);
      }
      else {
        lVar4 = 0x20;
        pcVar5 = "Thanks for your using. Good bye~";
        if (local_1bd != 0x71) goto LAB_00102735;
LAB_00102741:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,lVar4);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
        std::ostream::put('(');
        std::ostream::flush();
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
    } while (local_1bd != 0x71);
    M_tree::~M_tree((M_tree *)local_128);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    if(argc == 1 || argc > 3) {
        puts("error parameters");
        return 0;
    }

    //含程序自身参数，总参数数为2时，第2个参数为用于构建默克尔树的目录
    //含程序自身参数，总参数数为3时，第2个参数为用于构建默克尔树的目录，第3个参数为用于构建默克尔树和比较一致性的目录，
    //相关逻辑自行补充

    M_tree mtree_head;
    char input_lable;
    char check_fold[100];

    while(1) //整体实验大循环，完成实验3-1至3-4
    {
        //初始化创建叶子节点，注意根据目录下文件数分配空间
        //initalize_leaf函数，输出Node类型的数组，每个叶子节点的key可使用文件名，哈希值为文件所有数据的哈希，叶子节点初始化时，父节点、左右子节点为空，数据结构参考前述数据结构。未初始化时，key值可以设成-1.
        //hash函数可以是MD5，也可以是SHA-256，或自行设计哈希函数
        cout << "1. Building the M_tree." << endl;
        cout << "2. Updating the M_tree." << endl;
        cout << "3. Checking the difference between two folder." << endl;
        cout << "Please input 1~3 to using these function!" << endl;
        cin >> input_lable;
        switch(input_lable){
            case '1':
            {
                cout << "**************** We are building the Merkle tree. Please wait... ****************" << endl;
                mtree_head.folder_name1 = string(argv[1]);
                mtree_head.build(argv[1], 1);
                mtree_head.show(1, 1);
                break;
            }
            case '2':
            {
                cout << "**************** We are updating the Merkle tree. Please wait... ****************" << endl;
                mtree_head.update();
                mtree_head.show(1, 2);
                break;
            }
            case '3':
            {
                mtree_head.build(argv[1], 1);
                mtree_head.folder_name1 = string(argv[1]);
                if(argc == 2){
                    cout << "Please input the address, we will check their difference." << endl;
                    cin >> check_fold;
                    mtree_head.folder_name2 = string(check_fold);
                    mtree_head.build(check_fold, 3);
                }
                else{
                    mtree_head.folder_name2 = string(argv[2]);
                    mtree_head.build(argv[2], 3);
                }
                cout << "**************** We are checking the difference. Please wait... ****************" << endl;
                mtree_head.compare();
                break;
            }
            case 'q':
            {
                cout << "Thanks for your using. Good bye~" << endl;
                break;
            }
            default:{
                cout << "You inputed a wrong alphabet, Please input again." << endl;
            }
        }
        cout << endl;
        if(input_lable == 'q'){
            break;
        }
    }//结束大循环
}